

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void av1_encode_mv(AV1_COMP *cpi,aom_writer *w,ThreadData *td,MV *mv,MV *ref,nmv_context *mvctx,
                  int usehp)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  short sVar9;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  sVar9 = sVar2 - sVar4;
  if ((cpi->common).features.cur_frame_force_integer_mv != false) {
    usehp._0_1_ = -1;
  }
  aom_write_symbol(w,(uint)(sVar9 != 0) + (uint)(sVar1 != sVar3) * 2,mvctx->joints_cdf,4);
  if (sVar1 != sVar3) {
    encode_mv_component(w,(int)(short)(sVar1 - sVar3),mvctx->comps,(MvSubpelPrecision)usehp);
  }
  if (sVar2 != sVar4) {
    encode_mv_component(w,(int)sVar9,mvctx->comps + 1,(MvSubpelPrecision)usehp);
  }
  if ((cpi->sf).mv_sf.auto_mv_step_size != 0) {
    uVar6 = mv->row;
    uVar5 = mv->col;
    uVar8 = -uVar6;
    if (0 < (short)uVar6) {
      uVar8 = uVar6;
    }
    uVar6 = -uVar5;
    if (0 < (short)uVar5) {
      uVar6 = uVar5;
    }
    if (uVar6 < uVar8) {
      uVar6 = uVar8;
    }
    uVar7 = (uint)(uVar6 >> 3);
    if ((int)(uint)(uVar6 >> 3) < td->max_mv_magnitude) {
      uVar7 = td->max_mv_magnitude;
    }
    td->max_mv_magnitude = uVar7;
  }
  return;
}

Assistant:

void av1_encode_mv(AV1_COMP *cpi, aom_writer *w, ThreadData *td, const MV *mv,
                   const MV *ref, nmv_context *mvctx, int usehp) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);
  // If the mv_diff is zero, then we should have used near or nearest instead.
  assert(j != MV_JOINT_ZERO);
  if (cpi->common.features.cur_frame_force_integer_mv) {
    usehp = MV_SUBPEL_NONE;
  }
  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], usehp);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], usehp);

  // If auto_mv_step_size is enabled then keep track of the largest
  // motion vector component used.
  if (cpi->sf.mv_sf.auto_mv_step_size) {
    int maxv = AOMMAX(abs(mv->row), abs(mv->col)) >> 3;
    td->max_mv_magnitude = AOMMAX(maxv, td->max_mv_magnitude);
  }
}